

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O1

int nghttp2_pq_push(nghttp2_pq *pq,nghttp2_pq_entry *item)

{
  size_t index;
  ulong uVar1;
  nghttp2_pq_entry **ppnVar2;
  ulong uVar3;
  
  if (pq->capacity <= pq->length) {
    uVar1 = pq->capacity * 2;
    uVar3 = 4;
    if (4 < uVar1) {
      uVar3 = uVar1;
    }
    ppnVar2 = (nghttp2_pq_entry **)nghttp2_mem_realloc(pq->mem,pq->q,uVar3 * 8);
    if (ppnVar2 == (nghttp2_pq_entry **)0x0) {
      return -0x385;
    }
    pq->capacity = uVar3;
    pq->q = ppnVar2;
  }
  index = pq->length;
  pq->q[index] = item;
  item->index = index;
  pq->length = index + 1;
  bubble_up(pq,index);
  return 0;
}

Assistant:

int nghttp2_pq_push(nghttp2_pq *pq, nghttp2_pq_entry *item) {
  if (pq->capacity <= pq->length) {
    void *nq;
    size_t ncapacity;

    ncapacity = nghttp2_max(4, (pq->capacity * 2));

    nq = nghttp2_mem_realloc(pq->mem, pq->q,
                             ncapacity * sizeof(nghttp2_pq_entry *));
    if (nq == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }
    pq->capacity = ncapacity;
    pq->q = nq;
  }
  pq->q[pq->length] = item;
  item->index = pq->length;
  ++pq->length;
  bubble_up(pq, pq->length - 1);
  return 0;
}